

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_creader_set_buf(Curl_easy *data,char *buf,size_t blen)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  Curl_creader *r;
  
  CVar3 = Curl_creader_create(&r,data,&cr_buf,CURL_CR_CLIENT);
  if (CVar3 == CURLE_OK) {
    pvVar1 = r->ctx;
    *(char **)((long)pvVar1 + 0x20) = buf;
    *(size_t *)((long)pvVar1 + 0x28) = blen;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    cl_reset_reader(data);
    CVar3 = do_init_reader_stack(data,r);
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"add buf reader, len=%zu -> %d",blen,(ulong)CVar3);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_creader_set_buf(struct Curl_easy *data,
                               const char *buf, size_t blen)
{
  CURLcode result;
  struct Curl_creader *r;
  struct cr_buf_ctx *ctx;

  result = Curl_creader_create(&r, data, &cr_buf, CURL_CR_CLIENT);
  if(result)
    goto out;
  ctx = r->ctx;
  ctx->buf = buf;
  ctx->blen = blen;
  ctx->index = 0;

  cl_reset_reader(data);
  result = do_init_reader_stack(data, r);
out:
  CURL_TRC_READ(data, "add buf reader, len=%zu -> %d", blen, result);
  return result;
}